

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.cpp
# Opt level: O2

string * __thiscall
pbrt::DigitPermutation::ToString_abi_cxx11_(string *__return_storage_ptr__,DigitPermutation *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  int *args;
  int *in_R8;
  long lVar2;
  string s;
  int local_84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  int *local_78;
  string local_70;
  string local_50;
  
  local_78 = &this->nDigits;
  StringPrintf<int_const&,int_const&>
            (&local_70,(pbrt *)"[ DigitPermitation base: %d nDigits: %d permutations: ",(char *)this
             ,local_78,in_R8);
  local_84 = 0;
  local_80 = __return_storage_ptr__;
  while( true ) {
    pbVar1 = local_80;
    if (*local_78 <= local_84) break;
    args = local_78;
    StringPrintf<int&>(&local_50,(pbrt *)"[%d] ( ",(char *)&local_84,local_78);
    std::__cxx11::string::append((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    lVar2 = 0;
    while( true ) {
      if (this->base <= (int)lVar2) break;
      StringPrintf<unsigned_short&>
                (&local_50,(pbrt *)0x3d4e37,
                 (char *)(this->permutations + (long)local_84 * (long)this->base + lVar2),
                 (unsigned_short *)args);
      std::__cxx11::string::append((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      if ((int)lVar2 != this->base + -1) {
        std::__cxx11::string::append((char *)&local_70);
      }
      lVar2 = lVar2 + 1;
    }
    std::__cxx11::string::append((char *)&local_70);
    local_84 = local_84 + 1;
  }
  std::operator+(local_80,&local_70," ]");
  std::__cxx11::string::~string((string *)&local_70);
  return pbVar1;
}

Assistant:

std::string DigitPermutation::ToString() const {
    std::string s = StringPrintf(
        "[ DigitPermitation base: %d nDigits: %d permutations: ", base, nDigits);
    for (int digitIndex = 0; digitIndex < nDigits; ++digitIndex) {
        s += StringPrintf("[%d] ( ", digitIndex);
        for (int digitValue = 0; digitValue < base; ++digitValue) {
            s += StringPrintf("%d", permutations[digitIndex * base + digitValue]);
            if (digitValue != base - 1)
                s += ", ";
        }
        s += ") ";
    }

    return s + " ]";
}